

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

bool __thiscall
soplex::SPxFastRT<double>::shortEnter
          (SPxFastRT<double> *this,SPxId *enterId,int nr,double max,double maxabs)

{
  bool bVar1;
  element_type *this_00;
  UpdateVector<double> *pUVar2;
  SPxId *in_RSI;
  SSVectorBase<double> *in_RDI;
  double in_XMM0_Qa;
  Real RVar3;
  double dVar4;
  double in_XMM1_Qa;
  double x_1;
  double x;
  double shortval;
  SPxRatioTester<double> *in_stack_ffffffffffffff98;
  int i;
  bool local_1;
  
  SPxRatioTester<double>::tolerances(in_stack_ffffffffffffff98);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2bcd5c);
  RVar3 = Tolerances::scaleAccordingToEpsilon(this_00,1e-05);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2bcd7b);
  dVar4 = RVar3;
  bVar1 = SPxSolverBase<double>::isCoId
                    (*(SPxSolverBase<double> **)&(in_RDI->super_IdxSet).num,in_RSI);
  i = (int)((ulong)dVar4 >> 0x20);
  if (bVar1) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      pUVar2 = SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)&(in_RDI->super_IdxSet).num)
      ;
      UpdateVector<double>::delta(pUVar2);
      dVar4 = SSVectorBase<double>::operator[](in_RDI,i);
      if ((dVar4 < in_XMM1_Qa * RVar3) && (-dVar4 < in_XMM1_Qa * RVar3)) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    bVar1 = SPxSolverBase<double>::isId
                      (*(SPxSolverBase<double> **)&(in_RDI->super_IdxSet).num,in_RSI);
    if (bVar1) {
      if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
        pUVar2 = SPxSolverBase<double>::pVec(*(SPxSolverBase<double> **)&(in_RDI->super_IdxSet).num)
        ;
        UpdateVector<double>::delta(pUVar2);
        dVar4 = SSVectorBase<double>::operator[](in_RDI,i);
        if ((dVar4 < in_XMM1_Qa * RVar3) && (-dVar4 < in_XMM1_Qa * RVar3)) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SPxFastRT<R>::shortEnter(
   const SPxId& enterId,
   int nr,
   R max,
   R maxabs) const
{
   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   if(this->thesolver->isCoId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->coPvec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }
   else if(this->thesolver->isId(enterId))
   {
      if(max != 0.0)
      {
         R x = this->thesolver->pVec().delta()[nr];

         if(x < maxabs * shortval && -x < maxabs * shortval)
            return false;
      }

      return true;
   }

   return false;
}